

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyHaig.c
# Opt level: O0

int Ivy_ManHaigCountChoices(Ivy_Man_t *p,int *pnChoices)

{
  int iVar1;
  Ivy_Obj_t *pObj_00;
  int local_30;
  int i;
  int Counter;
  int nChoiceNodes;
  int nChoices;
  Ivy_Obj_t *pObj;
  int *pnChoices_local;
  Ivy_Man_t *p_local;
  
  if (p->pHaig != (Ivy_Man_t *)0x0) {
    i = 0;
    Counter = 0;
    for (local_30 = 0; iVar1 = Vec_PtrSize(p->pHaig->vObjs), local_30 < iVar1;
        local_30 = local_30 + 1) {
      pObj_00 = (Ivy_Obj_t *)Vec_PtrEntry(p->pHaig->vObjs,local_30);
      if ((((pObj_00 != (Ivy_Obj_t *)0x0) && (iVar1 = Ivy_ObjIsTerm(pObj_00), iVar1 == 0)) &&
          (local_30 != 0)) && (iVar1 = Ivy_ObjRefs(pObj_00), iVar1 != 0)) {
        iVar1 = Ivy_HaigObjCountClass(pObj_00);
        i = (uint)(1 < iVar1) + i;
        Counter = iVar1 + -1 + Counter;
      }
    }
    *pnChoices = Counter;
    return i;
  }
  __assert_fail("p->pHaig != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyHaig.c"
                ,0x141,"int Ivy_ManHaigCountChoices(Ivy_Man_t *, int *)");
}

Assistant:

int Ivy_ManHaigCountChoices( Ivy_Man_t * p, int * pnChoices )
{
    Ivy_Obj_t * pObj;
    int nChoices, nChoiceNodes, Counter, i;
    assert( p->pHaig != NULL );
    nChoices = nChoiceNodes = 0;
    Ivy_ManForEachObj( p->pHaig, pObj, i )
    {
        if ( Ivy_ObjIsTerm(pObj) || i == 0 )
            continue;
        if ( Ivy_ObjRefs(pObj) == 0 )
            continue;
        Counter = Ivy_HaigObjCountClass( pObj );
        nChoiceNodes += (int)(Counter > 1);
        nChoices += Counter - 1;
//        if ( Counter > 1 )
//            printf( "Choice node %d %s\n", pObj->Id, Ivy_ObjIsLatch(pObj)? "(latch)": "" );
    }
    *pnChoices = nChoices;
    return nChoiceNodes;
}